

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_deepseek::llm_build_deepseek
          (llm_build_deepseek *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  llm_graph_context *plVar4;
  ggml_tensor *gf_00;
  ggml_tensor *pgVar5;
  const_reference pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_backend_buffer *pgVar9;
  int extraout_var;
  ggml_tensor *pgVar10;
  int64_t iVar11;
  pointer plVar12;
  ggml_tensor *pgVar13;
  undefined8 in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  float fVar14;
  ggml_tensor *ffn_shexp;
  ggml_tensor *moe_out;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *rope_factors;
  ggml_tensor *inpSA;
  int il;
  float kq_scale;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd38;
  int iVar15;
  int iVar16;
  llm_graph_context *in_stack_fffffffffffffd40;
  ggml_tensor *in_stack_fffffffffffffd48;
  ggml_tensor *pgVar17;
  ggml_tensor *in_stack_fffffffffffffd50;
  ggml_tensor *pgVar18;
  llm_graph_context *plVar19;
  ggml_tensor *in_stack_fffffffffffffd58;
  undefined4 uVar20;
  ggml_tensor *cur_00;
  llm_graph_context *in_stack_fffffffffffffd60;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffdb8;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *in_stack_fffffffffffffdc8;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe18;
  ggml_tensor *in_stack_fffffffffffffe20;
  undefined1 *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  int64_t n_expert;
  llm_ffn_op_type type_op;
  ggml_tensor *in_stack_fffffffffffffe48;
  llm_graph_context *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe60;
  int il_00;
  ggml_tensor *in_stack_ffffffffffffff00;
  ggml_tensor *wo_b;
  ggml_tensor *wo;
  undefined4 in_stack_ffffffffffffff28;
  llm_graph_context *plVar21;
  ggml_tensor *in_stack_ffffffffffffff50;
  ggml_tensor *in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  ggml_tensor *local_90;
  ggml_tensor *local_88;
  ggml_tensor *local_80;
  ggml_tensor *local_70;
  uint local_68;
  ggml_tensor *local_50;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd50,
             (llm_graph_params *)in_stack_fffffffffffffd48);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2693,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2694,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  local_50 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  pgVar13 = local_50;
  pgVar3 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffda0);
  plVar4 = (llm_graph_context *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffde0);
  plVar21 = plVar4;
  if ((*(float *)(in_RDI->buffer + 0x1900) != 0.0) || (NAN(*(float *)(in_RDI->buffer + 0x1900)))) {
    fVar14 = *(float *)(in_RDI->buffer + 0x1900);
  }
  else {
    fVar14 = sqrtf((float)uVar1);
    fVar14 = 1.0 / fVar14;
  }
  for (local_68 = 0; iVar16 = (int)in_stack_ffffffffffffff60, (long)(int)local_68 < in_RDI->ne[3];
      local_68 = local_68 + 1) {
    local_70 = local_50;
    wo = local_50;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_68);
    gf_00 = llm_graph_context::build_norm
                      (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
                       ,in_stack_fffffffffffffd48,
                       (llm_norm_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                       (int)in_stack_fffffffffffffd40);
    uVar20 = (undefined4)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (char *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    pgVar5 = std::function<ggml_tensor_*(unsigned_int,_int)>::operator()
                       ((function<ggml_tensor_*(unsigned_int,_int)> *)in_stack_fffffffffffffd40,
                        (uint)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                        (ggml_type)in_stack_fffffffffffffd38);
    iVar15 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    wo_b = pgVar5;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_68);
    local_80 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                          in_stack_fffffffffffffd90);
    pgVar10 = local_80;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (char *)in_stack_fffffffffffffd40,iVar15);
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)(int)local_68);
    pgVar17 = in_stack_fffffffffffffdb8;
    if (pvVar6->bq != (ggml_tensor *)0x0) {
      pgVar17 = in_RDI->src[5];
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      local_80 = (ggml_tensor *)ggml_add(pgVar17,local_80,pvVar6->bq);
      in_stack_ffffffffffffff00 = local_80;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (char *)in_stack_fffffffffffffd40,iVar15);
      pgVar17 = in_stack_fffffffffffffdb8;
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_68);
    local_88 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                          in_stack_fffffffffffffd90);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (char *)in_stack_fffffffffffffd40,iVar15);
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)(int)local_68);
    if (pvVar6->bk != (ggml_tensor *)0x0) {
      pgVar18 = in_RDI->src[5];
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      local_88 = (ggml_tensor *)ggml_add(pgVar18,local_88,pvVar6->bk);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (char *)in_stack_fffffffffffffd40,iVar15);
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_68);
    local_90 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                          in_stack_fffffffffffffd90);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (char *)in_stack_fffffffffffffd40,iVar15);
    pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)(int)local_68);
    if (pvVar6->bv != (ggml_tensor *)0x0) {
      pgVar18 = in_RDI->src[5];
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      local_90 = (ggml_tensor *)ggml_add(pgVar18,local_90,pvVar6->bv);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (char *)in_stack_fffffffffffffd40,iVar15);
    }
    uVar7 = ggml_reshape_3d(in_RDI->src[5],local_80,uVar1,in_RDI->nb[3],
                            (long)*(int *)(in_RDI->src + 2));
    uVar8._0_4_ = in_RDI->op;
    uVar8._4_4_ = in_RDI->op_params[0];
    uVar8 = ggml_reshape_3d(in_RDI->src[5],local_88,uVar1,uVar8,(long)*(int *)(in_RDI->src + 2));
    uVar2._0_4_ = in_RDI->op;
    uVar2._4_4_ = in_RDI->op_params[0];
    pgVar9 = (ggml_backend_buffer *)
             ggml_reshape_3d(in_RDI->src[5],local_90,uVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
    ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],in_RDI->flags
                  ,*(undefined4 *)in_RDI->src,*(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],
                  uVar7,pgVar3,pgVar5,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],in_RDI->flags
                  ,*(undefined4 *)in_RDI->src,*(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],
                  uVar8,pgVar3,pgVar5,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (char *)in_stack_fffffffffffffd40,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (char *)in_stack_fffffffffffffd40,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (char *)in_stack_fffffffffffffd40,iVar15);
    plVar19 = plVar4;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_68);
    il_00 = (int)plVar19;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_68);
    cur_00 = (ggml_tensor *)CONCAT44(uVar20,local_68);
    pgVar18 = (ggml_tensor *)0x0;
    pgVar5 = (ggml_tensor *)0x0;
    iVar15 = extraout_var;
    local_48 = llm_graph_context::build_attn
                         (plVar21,(llm_graph_input_attn_kv_unified *)
                                  CONCAT44(fVar14,in_stack_ffffffffffffff28),(ggml_cgraph *)gf_00,wo
                          ,wo_b,pgVar10,pgVar13,in_RDI,in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff58,
                          (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),iVar16);
    if ((long)(int)local_68 == in_RDI->ne[3] + -1) {
      pgVar10 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd90)
      ;
      in_stack_fffffffffffffe60 = pgVar10;
      local_48 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_48,pgVar10);
      local_70 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_50,pgVar10);
    }
    iVar11 = ggml_add(in_RDI->src[5],local_48,local_70);
    n_expert = iVar11;
    llm_graph_context::cb((llm_graph_context *)pgVar18,pgVar5,(char *)pgVar9,iVar15);
    type_op = (llm_ffn_op_type)iVar11;
    in_stack_ffffffffffffff60 = n_expert;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_68);
    in_stack_fffffffffffffdb8 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffd60,cur_00,pgVar18,pgVar5,
                    (llm_norm_type)((ulong)pgVar9 >> 0x20),(int)pgVar9);
    pgVar10 = in_stack_fffffffffffffdb8;
    llm_graph_context::cb((llm_graph_context *)pgVar18,pgVar5,(char *)pgVar9,iVar15);
    if (local_68 < *(uint *)(in_RDI->buffer + 0x184c)) {
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      iVar16 = (int)in_stack_fffffffffffffe30;
      in_stack_fffffffffffffe18 = pvVar6->ffn_up;
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      in_stack_fffffffffffffe20 = pvVar6->ffn_gate;
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      in_stack_fffffffffffffd48 = pvVar6->ffn_down;
      in_stack_fffffffffffffd60 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd58 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd50 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd40 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd38 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffe28 = &stack0xfffffffffffffd38;
      local_48 = llm_graph_context::build_ffn
                           ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8
                            ,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                            in_stack_fffffffffffffdc0,pgVar17,in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00,
                            in_stack_fffffffffffffe08,in_stack_fffffffffffffdb8,
                            in_stack_fffffffffffffe18,(llm_ffn_op_type)in_stack_fffffffffffffe20,
                            (llm_ffn_gate_type)&stack0xfffffffffffffd38,iVar16);
      in_stack_fffffffffffffe10 = in_stack_fffffffffffffdb8;
      in_stack_fffffffffffffe30 = local_48;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (char *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      in_stack_fffffffffffffdb8 = pgVar17;
    }
    else {
      in_stack_fffffffffffffde0 = in_stack_fffffffffffffdb8;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)(int)local_68);
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      in_stack_fffffffffffffdf0 = pvVar6->ffn_up_exps;
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      in_stack_fffffffffffffdf8 = pvVar6->ffn_gate_exps;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)(int)local_68);
      pgVar9 = *(ggml_backend_buffer **)(in_RDI->op_params + 9);
      pgVar17 = *(ggml_tensor **)(in_RDI->op_params + 0xb);
      plVar19 = (llm_graph_context *)((ulong)pgVar18 & 0xffffffff00000000);
      iVar16 = 0;
      in_stack_fffffffffffffe00 = (ggml_tensor *)&stack0xfffffffffffffd38;
      in_stack_fffffffffffffe08 =
           llm_graph_context::build_moe_ffn
                     ((llm_graph_context *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                      in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                      (ggml_tensor *)&stack0xfffffffffffffd38,in_stack_fffffffffffffdf8,
                      in_stack_fffffffffffffe30,n_expert,(int64_t)pgVar10,type_op,
                      SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0),
                      SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x30,0),
                      SUB84(in_stack_fffffffffffffdf0,0),
                      (llama_expert_gating_func_type)in_stack_fffffffffffffe60,il_00);
      in_stack_ffffffffffffff58 = in_stack_fffffffffffffe08;
      llm_graph_context::cb(plVar19,pgVar17,(char *)pgVar9,iVar16);
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      in_stack_fffffffffffffdc0 = pvVar6->ffn_up_shexp;
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      in_stack_fffffffffffffdc8 = pvVar6->ffn_gate_shexp;
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_68);
      in_stack_fffffffffffffd48 = pvVar6->ffn_down_shexp;
      in_stack_fffffffffffffd60 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd58 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd50 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd40 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd38 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffdd0 = (ggml_tensor *)&stack0xfffffffffffffd38;
      in_stack_fffffffffffffdd8 =
           llm_graph_context::build_ffn
                     ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                      (ggml_tensor *)&stack0xfffffffffffffd38,in_stack_fffffffffffffdc8,
                      in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdf0,
                      in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,
                      in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                      (llm_ffn_op_type)in_stack_fffffffffffffe20,
                      (llm_ffn_gate_type)in_stack_fffffffffffffe28,(int)in_stack_fffffffffffffe30);
      in_stack_ffffffffffffff50 = in_stack_fffffffffffffdd8;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (char *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      local_48 = (ggml_tensor *)
                 ggml_add(in_RDI->src[5],in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (char *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    }
    ggml_add(in_RDI->src[5],local_48,in_stack_ffffffffffffff60);
    local_50 = llm_graph_context::build_cvec(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,0);
    in_stack_fffffffffffffda0 = local_50;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (char *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  }
  pgVar3 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                      in_stack_fffffffffffffd48,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                      (int)in_stack_fffffffffffffd40);
  iVar16 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  pgVar13 = pgVar3;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,iVar16);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4ec426);
  plVar12->t_embd = pgVar3;
  pgVar13 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffda0,pgVar13,
                       in_stack_fffffffffffffd90);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (char *)in_stack_fffffffffffffd40,iVar16);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4ec4ab);
  plVar12->t_logits = pgVar13;
  ggml_build_forward_expand(in_RCX,pgVar13);
  return;
}

Assistant:

llm_build_deepseek(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        const float kq_scale = hparams.f_attention_scale == 0.0f ? 1.0f/sqrtf(float(n_embd_head)) : hparams.f_attention_scale;

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // rope freq factors for llama3; may return nullptr for llama2 and other models
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, kq_scale, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }


            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            if ((uint32_t) il < hparams.n_layer_dense_lead) {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            } else {
                // MoE branch
                ggml_tensor * moe_out =
                    build_moe_ffn(cur,
                            model.layers[il].ffn_gate_inp,
                            model.layers[il].ffn_up_exps,
                            model.layers[il].ffn_gate_exps,
                            model.layers[il].ffn_down_exps,
                            nullptr,
                            n_expert, n_expert_used,
                            LLM_FFN_SILU, false,
                            false, hparams.expert_weights_scale,
                            LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                            il);
                cb(moe_out, "ffn_moe_out", il);

                // FFN shared expert
                {
                    ggml_tensor * ffn_shexp = build_ffn(cur,
                            model.layers[il].ffn_up_shexp,   NULL, NULL,
                            model.layers[il].ffn_gate_shexp, NULL, NULL,
                            model.layers[il].ffn_down_shexp, NULL, NULL,
                            NULL,
                            LLM_FFN_SILU, LLM_FFN_PAR, il);
                    cb(ffn_shexp, "ffn_shexp", il);

                    cur = ggml_add(ctx0, moe_out, ffn_shexp);
                    cb(cur, "ffn_out", il);
                }
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }